

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Output::canElideEmptySequence(Output *this)

{
  bool bVar1;
  size_t sVar2;
  reference pIVar3;
  Output *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
  if (sVar2 < 2) {
    this_local._7_1_ = true;
  }
  else {
    pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    if (*pIVar3 == inMapFirstKey) {
      sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
      pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::operator[]
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                          &this->StateStack,sVar2 - 2);
      bVar1 = inSeqAnyElement(*pIVar3);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Output::canElideEmptySequence() {
  // Normally, with an optional key/value where the value is an empty sequence,
  // the whole key/value can be not written.  But, that produces wrong yaml
  // if the key/value is the only thing in the map and the map is used in
  // a sequence.  This detects if the this sequence is the first key/value
  // in map that itself is embedded in a sequnce.
  if (StateStack.size() < 2)
    return true;
  if (StateStack.back() != inMapFirstKey)
    return true;
  return !inSeqAnyElement(StateStack[StateStack.size() - 2]);
}